

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O0

uint rlLoadFramebuffer(int width,int height)

{
  GLuint local_14;
  int local_10;
  uint fboId;
  int height_local;
  int width_local;
  
  local_14 = 0;
  local_10 = height;
  fboId = width;
  (*glad_glGenFramebuffers)(1,&local_14);
  (*glad_glBindFramebuffer)(0x8d40,0);
  return local_14;
}

Assistant:

unsigned int rlLoadFramebuffer(int width, int height)
{
    unsigned int fboId = 0;

#if (defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)) && defined(SUPPORT_RENDER_TEXTURES_HINT)
    glGenFramebuffers(1, &fboId);       // Create the framebuffer object
    glBindFramebuffer(GL_FRAMEBUFFER, 0);   // Unbind any framebuffer
#endif

    return fboId;
}